

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O1

ObjectPtr __thiscall ICM::DefFunc::Calc::Add<17UL>::func(Add<17UL> *this,DataList *list)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  int in_ECX;
  long *in_RDX;
  void *in_R8;
  unsigned_long i;
  long lVar3;
  
  iVar2 = Object::clone(*(Object **)in_RDX[1],(__fn *)list,in_RDX,in_ECX,in_R8);
  lVar1 = *in_RDX;
  if (lVar1 != 1) {
    lVar3 = 1;
    do {
      TypeBase::ListType::operator+=
                ((ListType *)((_func_int **)CONCAT44(extraout_var,iVar2))[1],
                 *(ListType **)(*(long *)(in_RDX[1] + lVar3 * 8) + 8));
      lVar3 = lVar3 + 1;
    } while (lVar1 != lVar3);
  }
  (this->super_FI)._vptr_FuncInitObject = (_func_int **)CONCAT44(extraout_var,iVar2);
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					Object *tmp = list.front()->clone();
					for (auto i : Range<size_t>(1, list.size()))
						tmp->dat<_TU>() += list[i]->dat<_TU>();
					return ObjectPtr(tmp);
				}